

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_list.c
# Opt level: O2

void check_list_add_front(List *lp,void *val)

{
  if (lp != (List *)0x0) {
    maybe_grow(lp);
    memmove(lp->data + 1,lp->data,(ulong)lp->n_elts << 3);
    lp->last = lp->last + 1;
    lp->n_elts = lp->n_elts + 1;
    lp->current = 0;
    *lp->data = val;
  }
  return;
}

Assistant:

void check_list_add_front(List * lp, void *val)
{
    if(lp == NULL)
        return;
    maybe_grow(lp);
    memmove(lp->data + 1, lp->data, lp->n_elts * sizeof lp->data[0]);
    lp->last++;
    lp->n_elts++;
    lp->current = 0;
    lp->data[lp->current] = val;
}